

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

void __thiscall soplex::SPxFastRT<double>::tighten(SPxFastRT<double> *this)

{
  double dVar1;
  bool bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ulong uVar5;
  Real RVar6;
  double dVar7;
  double dVar8;
  double local_58;
  
  peVar3 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    dVar7 = peVar3->s_epsilon_multiplier;
    uVar5 = -(ulong)(dVar7 == 1.0);
    dVar7 = (double)(~uVar5 & (ulong)(dVar7 * 1e-05) | uVar5 & 0x3ee4f8b588e368f1);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
    dVar7 = peVar3->s_epsilon_multiplier;
    uVar5 = -(ulong)(dVar7 == 1.0);
    dVar7 = (double)(~uVar5 & (ulong)(dVar7 * 1e-05) | uVar5 & 0x3ee4f8b588e368f1);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if ((this->super_SPxRatioTester<double>).delta + dVar7 <= this->fastDelta) {
    dVar8 = this->fastDelta - dVar7;
    this->fastDelta = dVar8;
    peVar3 = (this->super_SPxRatioTester<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (this->super_SPxRatioTester<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      dVar1 = peVar3->s_epsilon_multiplier;
      uVar5 = -(ulong)(dVar1 == 1.0);
      if ((double)(~uVar5 & (ulong)(dVar1 * 0.0001) | uVar5 & 0x3f1a36e2eb1c432d) < dVar8)
      goto LAB_002390c1;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
      dVar1 = peVar3->s_epsilon_multiplier;
      uVar5 = -(ulong)(dVar1 == 1.0);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      if ((double)(~uVar5 & (ulong)(dVar1 * 0.0001) | uVar5 & 0x3f1a36e2eb1c432d) < dVar8) {
        dVar8 = this->fastDelta;
LAB_002390c1:
        this->fastDelta = dVar8 - (dVar7 + dVar7);
      }
    }
  }
  local_58 = this->minStab;
  peVar3 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    uVar5 = -(ulong)(peVar3->s_epsilon_multiplier == 1.0);
    if ((double)(~uVar5 & (ulong)(peVar3->s_epsilon_multiplier * 1e-05) | uVar5 & 0x3ee4f8b588e368f1
                ) <= local_58) {
      return;
    }
    local_58 = local_58 / 0.9;
    this->minStab = local_58;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
    dVar7 = peVar3->s_epsilon_multiplier;
    uVar5 = -(ulong)(dVar7 == 1.0);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    if ((double)(~uVar5 & (ulong)(dVar7 * 1e-05) | uVar5 & 0x3ee4f8b588e368f1) <= local_58) {
      return;
    }
    peVar3 = (this->super_SPxRatioTester<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (this->super_SPxRatioTester<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_58 = this->minStab / 0.9;
    this->minStab = local_58;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
      bVar2 = false;
      goto LAB_002391c7;
    }
  }
  bVar2 = true;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_002391c7:
  RVar6 = Tolerances::floatingPointFeastol(peVar3);
  if (!bVar2) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (local_58 < RVar6) {
    this->minStab = this->minStab / 0.9;
  }
  return;
}

Assistant:

void SPxFastRT<R>::tighten()
{
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);

   if(fastDelta >= this->delta + delta_shift)
   {
      fastDelta -= delta_shift;

      if(fastDelta > this->tolerances()->scaleAccordingToEpsilon(1e-4))
         fastDelta -= 2 * delta_shift;
   }

   if(minStab < this->tolerances()->scaleAccordingToEpsilon(SOPLEX_MINSTAB))
   {
      minStab /= 0.90;

      if(minStab < this->tolerances()->floatingPointFeastol())
         minStab /= 0.90;
   }
}